

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O2

void deleteEmptyEdges(vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *v)

{
  pointer pPVar1;
  bool bVar2;
  long lVar3;
  pointer pPVar4;
  long lVar5;
  const_iterator __first;
  pointer this;
  
  this = (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pPVar1 = (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pPVar1 - (long)this;
  for (lVar3 = lVar5 / 0x48 >> 2; pPVar4 = this, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = Bipartition::isEmpty(&this->super_Bipartition);
    if (bVar2) goto LAB_001233d1;
    bVar2 = Bipartition::isEmpty(&this[1].super_Bipartition);
    pPVar4 = this + 1;
    if (bVar2) goto LAB_001233d1;
    bVar2 = Bipartition::isEmpty(&this[2].super_Bipartition);
    pPVar4 = this + 2;
    if (bVar2) goto LAB_001233d1;
    bVar2 = Bipartition::isEmpty(&this[3].super_Bipartition);
    pPVar4 = this + 3;
    if (bVar2) goto LAB_001233d1;
    this = this + 4;
    lVar5 = lVar5 + -0x120;
  }
  lVar5 = lVar5 / 0x48;
  if (lVar5 == 1) {
LAB_001233c0:
    bVar2 = Bipartition::isEmpty(&this->super_Bipartition);
    pPVar4 = this;
    if (!bVar2) {
      pPVar4 = pPVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_001233b0:
    bVar2 = Bipartition::isEmpty(&this->super_Bipartition);
    pPVar4 = this;
    if (!bVar2) {
      this = this + 1;
      goto LAB_001233c0;
    }
  }
  else {
    __first._M_current = pPVar1;
    if (lVar5 != 3) goto LAB_00123407;
    bVar2 = Bipartition::isEmpty(&this->super_Bipartition);
    if (!bVar2) {
      this = this + 1;
      goto LAB_001233b0;
    }
  }
LAB_001233d1:
  __first._M_current = pPVar4;
  if (pPVar4 != pPVar1) {
    while (pPVar4 = pPVar4 + 1, pPVar4 != pPVar1) {
      bVar2 = Bipartition::isEmpty(&pPVar4->super_Bipartition);
      if (!bVar2) {
        PhyloTreeEdge::operator=(__first._M_current,pPVar4);
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_00123407:
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::erase
            (v,__first,
             (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void deleteEmptyEdges(vector<PhyloTreeEdge> &v) {
    v.erase(std::remove_if(v.begin(), v.end(), [](PhyloTreeEdge &element) {
        return element.isEmpty();
    }), v.end());
}